

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server.c
# Opt level: O3

int socket_server_listen(socket_server *ss,uintptr_t opaque,char *addr,int port,int backlog)

{
  int __fd;
  int iVar1;
  request_package request;
  request_package rStack_228;
  
  __fd = do_bind(addr,port,6,(int *)&rStack_228);
  if (-1 < __fd) {
    iVar1 = listen(__fd,backlog);
    if (iVar1 != -1) {
      iVar1 = reserve_id(ss);
      if (-1 < iVar1) {
        rStack_228.u.open.id = iVar1;
        rStack_228.u.open.port = __fd;
        rStack_228.u.open.opaque = opaque;
        send_request(ss,&rStack_228,'L',0x18);
        return iVar1;
      }
      close(__fd);
      return iVar1;
    }
    close(__fd);
  }
  return -1;
}

Assistant:

int 
socket_server_listen(struct socket_server *ss, uintptr_t opaque, const char * addr, int port, int backlog) {
	int fd = do_listen(addr, port, backlog);
	if (fd < 0) {
		return -1;
	}
	struct request_package request;
	int id = reserve_id(ss);
	if (id < 0) {
		close(fd);
		return id;
	}
	request.u.listen.opaque = opaque;
	request.u.listen.id = id;
	request.u.listen.fd = fd;
	send_request(ss, &request, 'L', sizeof(request.u.listen));
	return id;
}